

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

obj_attr_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::attr
          (obj_attr_accessor *__return_storage_ptr__,object_api<pybind11::handle> *this,object *key)

{
  handle *phVar1;
  object local_30;
  handle local_28;
  object *local_20;
  object *key_local;
  object_api<pybind11::handle> *this_local;
  
  local_20 = key;
  key_local = (object *)this;
  this_local = (object_api<pybind11::handle> *)__return_storage_ptr__;
  phVar1 = derived(this);
  local_28.m_ptr = phVar1->m_ptr;
  object::object(&local_30,local_20);
  accessor<pybind11::detail::accessor_policies::obj_attr>::accessor
            (__return_storage_ptr__,local_28,&local_30);
  object::~object(&local_30);
  return __return_storage_ptr__;
}

Assistant:

obj_attr_accessor object_api<D>::attr(object &&key) const {
    return {derived(), std::move(key)};
}